

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warnings.cpp
# Opt level: O1

void __thiscall node::Warnings::Warnings(Warnings *this)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long in_FS_OFFSET;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  undefined8 local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  _Variadic_union<kernel::Warning,_node::Warning> local_78;
  undefined1 local_74;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  undefined8 local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  p_Var1 = &(this->m_warnings)._M_t._M_impl.super__Rb_tree_header;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_warnings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8 = &local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,
             "This is a pre-release test build - use at your own risk - do not use for mining or merchant applications"
             ,"");
  paVar2 = &local_98.field_2;
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    local_98._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,
               "This is a pre-release test build - use at your own risk - do not use for mining or merchant applications"
               ,"");
  }
  else {
    local_c0 = 
    "This is a pre-release test build - use at your own risk - do not use for mining or merchant applications"
    ;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              (&local_98,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_c0);
  }
  local_78 = (_Variadic_union<kernel::Warning,_node::Warning>)0x1;
  local_74 = 1;
  if (local_b8 == &local_a8) {
    local_60._8_8_ = local_a8._8_8_;
    local_70 = &local_60;
  }
  else {
    local_70 = local_b8;
  }
  local_60._M_allocated_capacity._1_7_ = local_a8._M_allocated_capacity._1_7_;
  local_60._M_local_buf[0] = local_a8._M_local_buf[0];
  local_68 = local_b0;
  local_b0 = 0;
  local_a8._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar2) {
    local_40._8_8_ = local_98.field_2._8_8_;
    local_50 = &local_40;
  }
  else {
    local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_98._M_dataplus._M_p;
  }
  local_40._M_allocated_capacity._1_7_ = local_98.field_2._M_allocated_capacity._1_7_;
  local_40._M_local_buf[0] = local_98.field_2._M_local_buf[0];
  local_48 = local_98._M_string_length;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8 = &local_a8;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::
  _Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
  ::_M_insert_unique<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>
            ((_Rb_tree<std::variant<kernel::Warning,node::Warning>,std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>,std::_Select1st<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>,std::less<std::variant<kernel::Warning,node::Warning>>,std::allocator<std::pair<std::variant<kernel::Warning,node::Warning>const,bilingual_str>>>
              *)&this->m_warnings,
             (pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str> *)
             &local_78._M_first);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0])
                             + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Warnings::Warnings()
{
    // Pre-release build warning
    if (!CLIENT_VERSION_IS_RELEASE) {
        m_warnings.insert(
            {Warning::PRE_RELEASE_TEST_BUILD,
             _("This is a pre-release test build - use at your own risk - do not use for mining or merchant applications")});
    }
}